

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O2

void h2v2_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                  JSAMPARRAY *output_data_ptr)

{
  JSAMPLE JVar1;
  JSAMPARRAY input_array;
  JSAMPLE *pJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  long lVar5;
  long lVar6;
  
  input_array = *output_data_ptr;
  lVar6 = 0;
  for (lVar5 = 0; lVar5 < cinfo->max_v_samp_factor; lVar5 = lVar5 + 2) {
    pJVar2 = input_data[lVar6];
    pJVar3 = input_array[lVar5];
    pJVar4 = pJVar3 + cinfo->output_width;
    for (; pJVar3 < pJVar4; pJVar3 = pJVar3 + 2) {
      JVar1 = *pJVar2;
      pJVar2 = pJVar2 + 1;
      *pJVar3 = JVar1;
      pJVar3[1] = JVar1;
    }
    jcopy_sample_rows(input_array,(uint)lVar5,input_array,(uint)lVar5 | 1,1,cinfo->output_width);
    lVar6 = lVar6 + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  register JSAMPROW inptr, outptr;
  register JSAMPLE invalue;
  JSAMPROW outend;
  int inrow, outrow;

  inrow = outrow = 0;
  while (outrow < cinfo->max_v_samp_factor) {
    inptr = input_data[inrow];
    outptr = output_data[outrow];
    outend = outptr + cinfo->output_width;
    while (outptr < outend) {
      invalue = *inptr++;
      *outptr++ = invalue;
      *outptr++ = invalue;
    }
    jcopy_sample_rows(output_data, outrow, output_data, outrow + 1, 1,
                      cinfo->output_width);
    inrow++;
    outrow += 2;
  }
}